

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

IceTUByte * icetImageGetColorcub(IceTImage image)

{
  if ((image.opaque_internals != (IceTVoid *)0x0) &&
     (*(int *)((long)image.opaque_internals + 4) == 0xc001)) {
    return (IceTUByte *)((long)image.opaque_internals + 0x1c);
  }
  icetRaiseDiagnostic("Color format is not of type ubyte.",0xfffffffb,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                      ,0x292);
  return (IceTUByte *)0x0;
}

Assistant:

const IceTUByte *icetImageGetColorcub(const IceTImage image)
{
    IceTEnum color_format = icetImageGetColorFormat(image);

    if (color_format != ICET_IMAGE_COLOR_RGBA_UBYTE) {
        icetRaiseError("Color format is not of type ubyte.",
                       ICET_INVALID_OPERATION);
        return NULL;
    }

    return icetImageGetColorConstVoid(image, NULL);
}